

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

void rsg::(anonymous_namespace)::convertExecValueTempl<float,int>
               (ExecConstValueAccess src,ExecValueAccess dst)

{
  int iVar1;
  int *piVar2;
  float src_00;
  int local_2c;
  undefined1 auStack_28 [4];
  int ndx;
  ExecValueAccess dst_local;
  ExecConstValueAccess src_local;
  
  dst_local.super_ConstStridedValueAccess<64>.m_type =
       (VariableType *)dst.super_ConstStridedValueAccess<64>.m_value;
  _auStack_28 = dst.super_ConstStridedValueAccess<64>.m_type;
  dst_local.super_ConstStridedValueAccess<64>.m_value = (Scalar *)src.m_type;
  for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 1) {
    src_00 = ConstStridedValueAccess<64>::as<float>
                       ((ConstStridedValueAccess<64> *)
                        &dst_local.super_ConstStridedValueAccess<64>.m_value,local_2c);
    iVar1 = convert<float,int>(src_00);
    piVar2 = StridedValueAccess<64>::as<int>((StridedValueAccess<64> *)auStack_28,local_2c);
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void convertExecValueTempl (ExecConstValueAccess src, ExecValueAccess dst)
{
	for (int ndx = 0; ndx < EXEC_VEC_WIDTH; ndx++)
		dst.as<DstType>(ndx) = convert<SrcType, DstType>(src.as<SrcType>(ndx));
}